

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptBigInt.cpp
# Opt level: O3

void Js::JavascriptBigInt::Increment(JavascriptBigInt *pbi)

{
  unsigned_long *puVar1;
  
  if (pbi->m_isNegative != true) {
    AbsoluteIncrement(pbi);
    return;
  }
  if ((pbi->m_length == 1) && (puVar1 = (pbi->m_digits).ptr, *puVar1 == 1)) {
    *puVar1 = 0;
    pbi->m_isNegative = false;
    return;
  }
  AbsoluteDecrement(pbi);
  return;
}

Assistant:

void JavascriptBigInt::Increment(JavascriptBigInt * pbi)
    {
        if (pbi->m_isNegative)
        {
            // return 0n for -1n
            if (pbi->m_length == 1 && pbi->m_digits[0] == 1)
            {
                JavascriptBigInt* result = pbi;
                result->m_digits[0] = 0;
                result->m_isNegative = false;
                return;
            }
            return JavascriptBigInt::AbsoluteDecrement(pbi);
        }
        return JavascriptBigInt::AbsoluteIncrement(pbi);
    }